

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::shaderexecutor::
InOutFuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::createInstance(InOutFuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                 *this,Context *context)

{
  deInt32 *pdVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  int iVar4;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  *this_00;
  undefined4 extraout_var;
  long lVar5;
  TestContext **ppTVar6;
  TestContext **ppTVar7;
  byte bVar8;
  StatementP local_118;
  Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  local_108;
  CaseContext local_a8;
  
  bVar8 = 0;
  this_00 = (BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
             *)operator_new(0x120);
  paVar2 = &local_a8.name.field_2;
  pcVar3 = (this->super_FuncCaseBase).super_PrecisionCase.m_ctx.name._M_dataplus._M_p;
  local_a8.name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,
             pcVar3 + (this->super_FuncCaseBase).super_PrecisionCase.m_ctx.name._M_string_length);
  ppTVar6 = &(this->super_FuncCaseBase).super_PrecisionCase.m_ctx.testContext;
  ppTVar7 = &local_a8.testContext;
  for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
    *ppTVar7 = *ppTVar6;
    ppTVar6 = ppTVar6 + (ulong)bVar8 * -2 + 1;
    ppTVar7 = ppTVar7 + (ulong)bVar8 * -2 + 1;
  }
  local_108.in0.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr
       = (this->m_variables).in0.
         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr;
  local_108.in0.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
  m_state = (this->m_variables).in0.
            super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_state;
  if (local_108.in0.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
      m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_108.in0.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
    m_state)->strongRefCount =
         (local_108.in0.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_state)->
         strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_108.in0.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
    m_state)->weakRefCount =
         (local_108.in0.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_state)->
         weakRefCount + 1;
    UNLOCK();
  }
  local_108.in1.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
  m_ptr = (this->m_variables).in1.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr;
  local_108.in1.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
  m_state = (this->m_variables).in1.
            super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state
  ;
  if (local_108.in1.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
      .m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_108.in1.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
    m_state)->strongRefCount =
         (local_108.in1.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state)
         ->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_108.in1.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
    m_state)->weakRefCount =
         (local_108.in1.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state)
         ->weakRefCount + 1;
    UNLOCK();
  }
  local_108.in2.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
  m_ptr = (this->m_variables).in2.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr;
  local_108.in2.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
  m_state = (this->m_variables).in2.
            super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state
  ;
  if (local_108.in2.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
      .m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_108.in2.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
    m_state)->strongRefCount =
         (local_108.in2.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state)
         ->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_108.in2.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
    m_state)->weakRefCount =
         (local_108.in2.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state)
         ->weakRefCount + 1;
    UNLOCK();
  }
  local_108.in3.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
  m_ptr = (this->m_variables).in3.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr;
  local_108.in3.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
  m_state = (this->m_variables).in3.
            super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state
  ;
  if (local_108.in3.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
      .m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_108.in3.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
    m_state)->strongRefCount =
         (local_108.in3.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state)
         ->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_108.in3.super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
    m_state)->weakRefCount =
         (local_108.in3.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state)
         ->weakRefCount + 1;
    UNLOCK();
  }
  local_108.out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.
  m_ptr = (this->m_variables).out0.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_ptr;
  local_108.out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.
  m_state = (this->m_variables).out0.
            super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_state
  ;
  if (local_108.out0.
      super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_108.out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
    .m_state)->strongRefCount =
         (local_108.out0.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_state)
         ->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_108.out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
    .m_state)->weakRefCount =
         (local_108.out0.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_state)
         ->weakRefCount + 1;
    UNLOCK();
  }
  local_108.out1.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr
       = (this->m_variables).out1.
         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr;
  local_108.out1.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
  m_state = (this->m_variables).out1.
            super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_state;
  if (local_108.out1.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
      m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_108.out1.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
    m_state)->strongRefCount =
         (local_108.out1.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_state)->
         strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_108.out1.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
    m_state)->weakRefCount =
         (local_108.out1.
          super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_state)->
         weakRefCount + 1;
    UNLOCK();
  }
  iVar4 = (*(this->super_FuncCaseBase).super_PrecisionCase.super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[7])(this);
  local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr =
       (this->super_FuncCaseBase).m_stmt.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr
  ;
  local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state =
       (this->super_FuncCaseBase).m_stmt.super_SharedPtr<const_vkt::shaderexecutor::Statement>.
       m_state;
  if (local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->strongRefCount =
         (local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->strongRefCount +
         1;
    UNLOCK();
    LOCK();
    (local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->weakRefCount =
         (local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->weakRefCount + 1
    ;
    UNLOCK();
  }
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  ::BuiltinPrecisionCaseTestInstance
            (this_00,context,&local_a8,&(this->super_FuncCaseBase).super_PrecisionCase.m_spec,
             &local_108,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)CONCAT44(extraout_var,iVar4),&local_118);
  if (local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr = (Statement *)0x0;
      (*(local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->
          _vptr_SharedPtrStateBase[1])();
      }
      local_118.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  ::~Variables(&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8.name._M_dataplus._M_p,local_a8.name.field_2._M_allocated_capacity + 1);
  }
  return &this_00->super_TestInstance;
}

Assistant:

virtual TestInstance*				createInstance	(Context& context) const
	{
		return new BuiltinPrecisionCaseTestInstance<In, Out>(context, m_ctx, m_spec, m_variables, getSamplings(), m_stmt);
	}